

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QtPrivate::QColorShowLabel::mouseMoveEvent(QColorShowLabel *this,QMouseEvent *e)

{
  int iVar1;
  int iVar2;
  QMimeData *this_00;
  QDrag *this_01;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QDrag *drg;
  QMimeData *mime;
  QPainter p;
  QPixmap pix;
  DropAction in_stack_ffffffffffffff2c;
  QPoint *in_stack_ffffffffffffff38;
  QMimeData *pQVar3;
  int in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  QPainter *in_stack_ffffffffffffff48;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  QPointF local_48;
  QPoint local_38;
  QPoint local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((byte)in_RDI[0x38] & 1) != 0) {
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)0x733f23);
    local_38 = QPointF::toPoint((QPointF *)
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    local_30 = ::operator-((QPoint *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           in_stack_ffffffffffffff38);
    iVar1 = QPoint::manhattanLength
                      ((QPoint *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar2 = QApplication::startDragDistance();
    if (iVar2 < iVar1) {
      this_00 = (QMimeData *)operator_new(0x10);
      QMimeData::QMimeData(this_00);
      pQVar3 = this_00;
      QColor::operator_cast_to_QVariant((QColor *)&local_28);
      QMimeData::setColorData((QVariant *)pQVar3);
      ::QVariant::~QVariant(&local_28);
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)&local_60,0x1e,0x14);
      QPixmap::fill((QColor *)&local_60);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_68,(QPaintDevice *)&local_60);
      iVar1 = QPixmap::width();
      iVar1 = iVar1 + -1;
      QPixmap::height();
      QPainter::drawRect(in_stack_ffffffffffffff48,iVar1,in_stack_ffffffffffffff40,
                         (int)((ulong)pQVar3 >> 0x20),(int)pQVar3);
      QPainter::end();
      this_01 = (QDrag *)operator_new(0x10);
      QDrag::QDrag(this_01,in_RDI);
      QDrag::setMimeData((QMimeData *)this_01);
      QDrag::setPixmap((QPixmap *)this_01);
      in_RDI[0x38] = (QObject)0x0;
      QFlags<Qt::DropAction>::QFlags((QFlags<Qt::DropAction> *)this_00,in_stack_ffffffffffffff2c);
      QDrag::exec((QFlags_conflict1 *)this_01);
      QPainter::~QPainter((QPainter *)&local_68);
      QPixmap::~QPixmap((QPixmap *)&local_60);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorShowLabel::mouseMoveEvent(QMouseEvent *e)
{
#if !QT_CONFIG(draganddrop)
    Q_UNUSED(e);
#else
    if (!mousePressed)
        return;
    if ((pressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance()) {
        QMimeData *mime = new QMimeData;
        mime->setColorData(col);
        QPixmap pix(30, 20);
        pix.fill(col);
        QPainter p(&pix);
        p.drawRect(0, 0, pix.width() - 1, pix.height() - 1);
        p.end();
        QDrag *drg = new QDrag(this);
        drg->setMimeData(mime);
        drg->setPixmap(pix);
        mousePressed = false;
        drg->exec(Qt::CopyAction);
    }
#endif
}